

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_align_first_layer(REF_GRID ref_grid,REF_CLOUD ref_cloud,REF_LIST ref_list)

{
  REF_CELL pRVar1;
  REF_NODE ref_node_00;
  REF_GEOM ref_geom_00;
  uint uVar2;
  double dVar3;
  double local_1b8;
  int local_1b0;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rsb_1;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_CAVITY ref_cavity;
  REF_DBL uv [2];
  REF_INT id;
  REF_INT type;
  REF_GLOB global;
  REF_INT new_node;
  REF_INT closest_node;
  REF_DBL dist;
  REF_DBL xyz [3];
  REF_DBL h;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL dot;
  REF_DBL m [6];
  REF_DBL d [12];
  REF_DBL normal [3];
  int local_44;
  REF_INT node;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_LIST ref_list_local;
  REF_CLOUD ref_cloud_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->cell[0];
  ref_node_00 = ref_grid->node;
  ref_geom_00 = ref_grid->geom;
  local_44 = 0;
  do {
    if (ref_node_00->max <= local_44) {
      return 0;
    }
    if (((-1 < local_44) && (local_44 < ref_node_00->max)) && (-1 < ref_node_00->global[local_44]))
    {
      if ((local_44 < 0) || (pRVar1->ref_adj->nnode <= local_44)) {
        local_1b0 = -1;
      }
      else {
        local_1b0 = pRVar1->ref_adj->first[local_44];
      }
      if (local_1b0 != -1) {
        uVar2 = ref_layer_twod_normal(ref_grid,local_44,d + 0xb);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x226,"ref_layer_align_first_layer",(ulong)uVar2,"twod normal");
          return uVar2;
        }
        uVar2 = ref_node_metric_get(ref_node_00,local_44,&dot);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x227,"ref_layer_align_first_layer",(ulong)uVar2,"get");
          return uVar2;
        }
        uVar2 = ref_matrix_diag_m(&dot,m + 5);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x228,"ref_layer_align_first_layer",(ulong)uVar2,"eigen decomp");
          return uVar2;
        }
        uVar2 = ref_matrix_descending_eig_twod(m + 5);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x229,"ref_layer_align_first_layer",(ulong)uVar2,"2D eig sort");
          return uVar2;
        }
        local_1b8 = normal[1] * d[4] + d[0xb] * d[2] + normal[0] * d[3];
        if (local_1b8 <= 0.0) {
          local_1b8 = -local_1b8;
        }
        if (0.9848 < local_1b8) {
          dVar3 = sqrt(m[5]);
          dVar3 = 1.0 / dVar3;
          dist = dVar3 * d[0xb] + ref_node_00->real[local_44 * 0xf];
          xyz[0] = dVar3 * normal[0] + ref_node_00->real[local_44 * 0xf + 1];
          xyz[1] = dVar3 * normal[1] + ref_node_00->real[local_44 * 0xf + 2];
          uVar2 = ref_node_nearest_xyz
                            (ref_node_00,&dist,(REF_INT *)((long)&global + 4),(REF_DBL *)&new_node);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x237,"ref_layer_align_first_layer",(ulong)uVar2,"close");
            return uVar2;
          }
          uVar2 = ref_node_next_global(ref_node_00,(REF_GLOB *)&id);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x238,"ref_layer_align_first_layer",(ulong)uVar2,"global");
            return uVar2;
          }
          uVar2 = ref_cloud_push(ref_cloud,_id,d + 0xb);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x239,"ref_layer_align_first_layer",(ulong)uVar2,"store cloud");
            return uVar2;
          }
          uVar2 = ref_list_push(ref_list,local_44);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x23a,"ref_layer_align_first_layer",(ulong)uVar2,"store list");
            return uVar2;
          }
          uVar2 = ref_node_add(ref_node_00,_id,(REF_INT *)&global);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x23b,"ref_layer_align_first_layer",(ulong)uVar2,"add");
            return uVar2;
          }
          ref_node_00->real[(int)global * 0xf] = dist;
          ref_node_00->real[(int)global * 0xf + 1] = xyz[0];
          ref_node_00->real[(int)global * 0xf + 2] = xyz[1];
          uv[1]._4_4_ = 2;
          uVar2 = ref_geom_unique_id(ref_geom_00,local_44,2,(REF_INT *)(uv + 1));
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x240,"ref_layer_align_first_layer",(ulong)uVar2,"unique face id");
            return uVar2;
          }
          uVar2 = ref_geom_tuv(ref_geom_00,local_44,uv[1]._4_4_,uv[1]._0_4_,(REF_DBL *)&ref_cavity);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x241,"ref_layer_align_first_layer",(ulong)uVar2,"uv");
            return uVar2;
          }
          uVar2 = ref_egads_inverse_eval
                            (ref_geom_00,uv[1]._4_4_,uv[1]._0_4_,&dist,(REF_DBL *)&ref_cavity);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x242,"ref_layer_align_first_layer",(ulong)uVar2,"inverse uv");
            return uVar2;
          }
          uVar2 = ref_geom_add(ref_geom_00,(int)global,uv[1]._4_4_,uv[1]._0_4_,
                               (REF_DBL *)&ref_cavity);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x243,"ref_layer_align_first_layer",(ulong)uVar2,"new geom");
            return uVar2;
          }
          uVar2 = ref_metric_interpolate_between(ref_grid,local_44,-1,(int)global);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x245,"ref_layer_align_first_layer",(ulong)uVar2,"metric interp");
            return uVar2;
          }
          uVar2 = ref_cavity_create((REF_CAVITY *)&ref_private_macro_code_rss_5);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x246,"ref_layer_align_first_layer",(ulong)uVar2,"cav create");
            return uVar2;
          }
          uVar2 = ref_cavity_form_insert
                            (_ref_private_macro_code_rss_5,ref_grid,(int)global,local_44,-1,-1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x249,"ref_layer_align_first_layer",(ulong)uVar2,"ball");
            return uVar2;
          }
          uVar2 = ref_cavity_enlarge_conforming(_ref_private_macro_code_rss_5);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x24d,"ref_layer_align_first_layer",(ulong)uVar2,"enlarge");
            ref_cavity_tec(_ref_private_macro_code_rss_5,"cav-fail.tec");
            ref_export_by_extension(ref_grid,"mesh-fail.tec");
            return uVar2;
          }
          uVar2 = ref_cavity_replace(_ref_private_macro_code_rss_5);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x254,"ref_layer_align_first_layer",(ulong)uVar2,"cav replace");
            ref_cavity_tec(_ref_private_macro_code_rss_5,"ref_layer_align_quad_cavity.tec");
            ref_export_by_extension(ref_grid,"ref_layer_align_quad_mesh.tec");
            printf("norm %f %f %f dir %f %f %f dot %f\n",d[0xb],normal[0],normal[1],d[2],d[3],d[4],
                   normal[1] * d[4] + d[0xb] * d[2] + normal[0] * d[3]);
            printf("new %f %f %f\n",dist,xyz[0],xyz[1]);
            return uVar2;
          }
          uVar2 = ref_cavity_free(_ref_private_macro_code_rss_5);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x255,"ref_layer_align_first_layer",(ulong)uVar2,"cav free");
            return uVar2;
          }
        }
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_layer_align_first_layer(REF_GRID ref_grid,
                                                      REF_CLOUD ref_cloud,
                                                      REF_LIST ref_list) {
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT node;

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_cell_node_empty(ref_cell, node)) {
      REF_DBL normal[3];

      REF_DBL d[12], m[6];
      REF_DBL dot;
      RSS(ref_layer_twod_normal(ref_grid, node, normal), "twod normal");
      RSS(ref_node_metric_get(ref_node, node, m), "get");
      RSS(ref_matrix_diag_m(m, d), "eigen decomp");
      RSS(ref_matrix_descending_eig_twod(d), "2D eig sort");
      dot = ref_math_dot(normal, &(d[3]));
      if (ABS(dot) > 0.9848) { /* cos(10 degrees) */
        REF_DBL h, xyz[3], dist;
        REF_INT closest_node;
        REF_INT new_node;
        REF_GLOB global;
        REF_INT type, id;
        REF_DBL uv[2];
        REF_CAVITY ref_cavity;
        h = 1.0 / sqrt(d[0]);
        xyz[0] = ref_node_xyz(ref_node, 0, node) + h * normal[0];
        xyz[1] = ref_node_xyz(ref_node, 1, node) + h * normal[1];
        xyz[2] = ref_node_xyz(ref_node, 2, node) + h * normal[2];
        RSS(ref_node_nearest_xyz(ref_node, xyz, &closest_node, &dist), "close");
        RSS(ref_node_next_global(ref_node, &global), "global");
        RSS(ref_cloud_push(ref_cloud, global, normal), "store cloud");
        RSS(ref_list_push(ref_list, node), "store list");
        RSS(ref_node_add(ref_node, global, &new_node), "add");
        ref_node_xyz(ref_node, 0, new_node) = xyz[0];
        ref_node_xyz(ref_node, 1, new_node) = xyz[1];
        ref_node_xyz(ref_node, 2, new_node) = xyz[2];
        type = REF_GEOM_FACE;
        RSS(ref_geom_unique_id(ref_geom, node, type, &id), "unique face id");
        RSS(ref_geom_tuv(ref_geom, node, type, id, uv), "uv");
        RSS(ref_egads_inverse_eval(ref_geom, type, id, xyz, uv), "inverse uv");
        RSS(ref_geom_add(ref_geom, new_node, type, id, uv), "new geom");
        RSS(ref_metric_interpolate_between(ref_grid, node, REF_EMPTY, new_node),
            "metric interp");
        RSS(ref_cavity_create(&ref_cavity), "cav create");
        RSS(ref_cavity_form_insert(ref_cavity, ref_grid, new_node, node,
                                   REF_EMPTY, REF_EMPTY),
            "ball");
        RSB(ref_cavity_enlarge_conforming(ref_cavity), "enlarge", {
          ref_cavity_tec(ref_cavity, "cav-fail.tec");
          ref_export_by_extension(ref_grid, "mesh-fail.tec");
        });
        RSB(ref_cavity_replace(ref_cavity), "cav replace", {
          ref_cavity_tec(ref_cavity, "ref_layer_align_quad_cavity.tec");
          ref_export_by_extension(ref_grid, "ref_layer_align_quad_mesh.tec");
          printf("norm %f %f %f dir %f %f %f dot %f\n", normal[0], normal[1],
                 normal[2], d[3], d[4], d[5], ref_math_dot(normal, &(d[3])));
          printf("new %f %f %f\n", xyz[0], xyz[1], xyz[2]);
        });
        RSS(ref_cavity_free(ref_cavity), "cav free");
      }
    }
  }
  return REF_SUCCESS;
}